

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O2

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>
          (SafeOrderList<ncnn::ObjectBox> *this,ObjectBoxNmsCondition match)

{
  const_iterator cVar1;
  bool bVar2;
  const_iterator __position;
  ObjectBoxNmsCondition local_38;
  
  local_38.top_box = match.top_box;
  local_38.nms_threshold = match.nms_threshold;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  cVar1._M_node =
       (this->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  while (__position._M_node = cVar1._M_node,
        (SafeOrderList<ncnn::ObjectBox> *)__position._M_node != this) {
    bVar2 = ObjectBoxNmsCondition::operator()(&local_38,(ObjectBox *)(__position._M_node + 1));
    cVar1._M_node = (__position._M_node)->_M_next;
    if (bVar2) {
      std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::erase
                (&this->container,__position);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void remove_all_match(MatchFun match)
  {
    MutexLockGuard guard(mutex);
    Iterator iter = container.begin();
    for (; iter != container.end();)
    {
      if (match(*iter))
        container.erase(iter++);
      else
        iter++;
    }
  }